

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintTools.h
# Opt level: O0

void PrintTools::PrintProgress<char_const*>(char *prefix,LIndex i,LIndex nr,size_t interval)

{
  _Setprecision _Var1;
  ostream *poVar2;
  ulong in_RCX;
  ulonglong in_RDX;
  ulong in_RSI;
  char *in_RDI;
  double dVar3;
  double dVar4;
  
  if ((in_RSI % in_RCX == 0) && (in_RCX < in_RSI)) {
    poVar2 = std::operator<<((ostream *)&std::cout,in_RDI);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RSI);
    poVar2 = std::operator<<(poVar2," of ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RDX);
    poVar2 = std::operator<<(poVar2," - ");
    _Var1 = std::setprecision(4);
    poVar2 = std::operator<<(poVar2,_Var1);
    dVar3 = Globals::CastLIndexToDouble(in_RSI);
    dVar4 = Globals::CastLIndexToDouble(in_RDX);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(dVar3 / dVar4) * 100.0);
    poVar2 = std::operator<<(poVar2,"%");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

static void PrintProgress(T prefix, LIndex i,
                   LIndex nr, size_t interval)
{
    if(i % interval == 0&& i > interval)
    {
        std::cout << prefix << " "<< i << " of " << nr << " - "
                  << std::setprecision(4)
                  << (CastLIndexToDouble(i) / CastLIndexToDouble(nr)) * 100
                  << "%" << std::endl;
    }
}